

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[50],char_const*,char[16],char_const*,char[4],char[20],unsigned_int,char[41],unsigned_int,char[6],char_const*>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [50],char **Args_1,
          char (*Args_2) [16],char **Args_3,char (*Args_4) [4],char (*Args_5) [20],uint *Args_6,
          char (*Args_7) [41],uint *Args_8,char (*Args_9) [6],char **Args_10)

{
  stringstream local_1e0 [8];
  stringstream ss;
  char (*Args_local_4) [4];
  char **Args_local_3;
  char (*Args_local_2) [16];
  char **Args_local_1;
  char (*Args_local) [50];
  
  std::__cxx11::stringstream::stringstream(local_1e0);
  FormatStrSS<std::__cxx11::stringstream,char[50],char_const*,char[16],char_const*,char[4],char[20],unsigned_int,char[41],unsigned_int,char[6],char_const*>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,
             (char (*) [50])this,(char **)Args,(char (*) [16])Args_1,(char **)Args_2,
             (char (*) [4])Args_3,(char (*) [20])Args_4,(uint *)Args_5,(char (*) [41])Args_6,
             (uint *)Args_7,(char (*) [6])Args_8,(char **)Args_9);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1e0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}